

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool Js::JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment
               (SparseArraySegmentBase *headSegmentBeforeOperation,
               uint32 headSegmentLengthBeforeOperation,Var varAfterOperation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase *pSVar4;
  
  if (varAfterOperation == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e0,"(varAfterOperation)","varAfterOperation");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (headSegmentBeforeOperation == (SparseArraySegmentBase *)0x0) {
    bVar2 = false;
  }
  else {
    pSVar4 = Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(varAfterOperation);
    bVar2 = true;
    if (pSVar4 == headSegmentBeforeOperation) {
      bVar2 = pSVar4->length != headSegmentLengthBeforeOperation;
    }
  }
  return bVar2;
}

Assistant:

bool JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
        const SparseArraySegmentBase *const headSegmentBeforeOperation,
        const uint32 headSegmentLengthBeforeOperation,
        const Var varAfterOperation)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Array_Jit_OperationInvalidatedArrayHeadSegment);
        Assert(varAfterOperation);

        if(!headSegmentBeforeOperation)
        {
            return false;
        }

        const SparseArraySegmentBase *const headSegmentAfterOperation =
            Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(varAfterOperation);
        return
            headSegmentAfterOperation != headSegmentBeforeOperation ||
            headSegmentAfterOperation->length != headSegmentLengthBeforeOperation;
        JIT_HELPER_END(Array_Jit_OperationInvalidatedArrayHeadSegment);
    }